

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

void kratos::remove_stmt_from_parent(shared_ptr<kratos::Stmt> *stmt)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  Generator *this;
  long lVar2;
  InternalException *pIVar3;
  StmtException *pSVar4;
  undefined1 auVar5 [16];
  initializer_list<kratos::IRNode_*> __l;
  initializer_list<kratos::IRNode_*> __l_00;
  element_type *local_68;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_60;
  string local_48;
  allocator<char> local_22;
  allocator_type local_21;
  
  iVar1 = (*(((stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[4])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (lVar2 == 0) {
    return;
  }
  if (*(int *)(lVar2 + 0x48) != 2) {
    if (*(int *)(lVar2 + 0x48) == 0) {
      this = (Generator *)__dynamic_cast(lVar2,&IRNode::typeinfo,&Generator::typeinfo,0);
      Generator::remove_stmt(this,stmt);
      return;
    }
    pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Internal error",&local_22);
    local_68 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_68;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_60,__l,&local_21);
    StmtException::StmtException(pSVar4,&local_48,&local_60);
    __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar2 = __dynamic_cast(lVar2,&IRNode::typeinfo,&Stmt::typeinfo,0);
  iVar1 = *(int *)(lVar2 + 0x78);
  if (iVar1 == 0) {
    auVar5 = __dynamic_cast(lVar2,&Stmt::typeinfo,&IfStmt::typeinfo,0);
    if (auVar5._0_8_ == 0) {
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"stmt is not if but is marked as StatementType::If",
                 (allocator<char> *)&local_60);
      InternalException::InternalException(pIVar3,&local_48);
      __cxa_throw(pIVar3,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else if (iVar1 == 4) {
    auVar5 = __dynamic_cast(lVar2,&Stmt::typeinfo,&StmtBlock::typeinfo,0);
    if (auVar5._0_8_ == 0) {
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,
                 "stmt is not block but is marked as StatementType::StatementType::Block",
                 (allocator<char> *)&local_60);
      InternalException::InternalException(pIVar3,&local_48);
      __cxa_throw(pIVar3,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (iVar1 != 1) {
      pSVar4 = (StmtException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Internal error",&local_22);
      local_68 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_68;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                (&local_60,__l_00,&local_21);
      StmtException::StmtException(pSVar4,&local_48,&local_60);
      __cxa_throw(pSVar4,&StmtException::typeinfo,std::runtime_error::~runtime_error);
    }
    auVar5 = __dynamic_cast(lVar2,&Stmt::typeinfo,&SwitchStmt::typeinfo,0);
    if (auVar5._0_8_ == 0) {
      pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"stmt is not switch but is marked as StatementType::Switch",
                 (allocator<char> *)&local_60);
      InternalException::InternalException(pIVar3,&local_48);
      __cxa_throw(pIVar3,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  UNRECOVERED_JUMPTABLE = *(code **)(*auVar5._0_8_ + 0x50);
  (*UNRECOVERED_JUMPTABLE)(auVar5._0_8_,stmt,auVar5._8_8_,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void remove_stmt_from_parent(const std::shared_ptr<Stmt> &stmt) {
    auto *parent = stmt->parent();
    if (!parent) return;
    if (parent->ir_node_kind() == IRNodeKind::GeneratorKind) {
        auto *p = dynamic_cast<Generator *>(parent);
        p->remove_stmt(stmt);
    } else {
        if (parent->ir_node_kind() != IRNodeKind::StmtKind) {
            throw StmtException("Internal error", {stmt.get()});
        }
        auto *p_stmt = dynamic_cast<Stmt *>(parent);
        if (p_stmt->type() == StatementType::Switch) {
            auto *p = dynamic_cast<SwitchStmt *>(p_stmt);
            if (!p)
                throw InternalException(
                    "stmt is not switch but is marked as StatementType::Switch");
            p->remove_stmt(stmt);
        } else if (p_stmt->type() == StatementType::If) {
            auto *p = dynamic_cast<IfStmt *>(p_stmt);
            if (!p) throw InternalException("stmt is not if but is marked as StatementType::If");
            p->remove_stmt(stmt);
        } else {
            if (p_stmt->type() != StatementType::Block) {
                throw StmtException("Internal error", {stmt.get()});
            }
            auto *p = dynamic_cast<StmtBlock *>(p_stmt);
            if (!p)
                throw InternalException(
                    "stmt is not block but is marked as StatementType::StatementType::Block");
            p->remove_stmt(stmt);
        }
    }
}